

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::sortTracksNoteOffsBeforeOns(MidiFile *this)

{
  reference ppMVar1;
  int i;
  size_type __n;
  
  if (this->m_theTimeState == 1) {
    for (__n = 0; (long)__n <
                  (long)(int)((ulong)((long)(this->m_events).
                                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_events).
                                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        __n = __n + 1) {
      ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                          (&this->m_events,__n);
      MidiEventList::sortNoteOffsBeforeOns(*ppMVar1);
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Warning: Sorting only allowed in absolute tick mode.");
  return;
}

Assistant:

void MidiFile::sortTracksNoteOffsBeforeOns(void) {
	if (m_theTimeState == TIME_STATE_ABSOLUTE) {
		for (int i=0; i<getTrackCount(); i++) {
			m_events.at(i)->sortNoteOffsBeforeOns();
		}
	} else {
		std::cerr << "Warning: Sorting only allowed in absolute tick mode.";
	}
}